

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall duckdb::StringValueScanner::Flush(StringValueScanner *this,DataChunk *insert_chunk)

{
  CSVReaderOptions *pCVar1;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  optional_idx byte_position;
  optional_idx byte_position_00;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_01;
  bool bVar2;
  int iVar3;
  idx_t entry_idx_1;
  undefined4 extraout_var;
  DataChunk *this_02;
  CSVErrorHandler *pCVar4;
  CSVFileScan *pCVar5;
  long lVar6;
  reference this_03;
  CSVBufferManager *pCVar7;
  CSVStateMachine *pCVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  CSVReaderOptions *pCVar13;
  iterator iVar14;
  CSVBufferHandle *pCVar15;
  InvalidInputException *this_04;
  LogicalTypeId type;
  shared_ptr<duckdb::CSVFileScan,_true> *this_05;
  idx_t iVar16;
  string *psVar17;
  ulong uVar18;
  undefined4 in_stack_fffffffffffffbec;
  undefined7 uStack_408;
  bool first_nl_1;
  idx_t line_error;
  StringValueScanner *local_3f8;
  string *local_3f0;
  reference local_3e8;
  LogicalType *local_3e0;
  DataChunk *local_3d8;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_3d0;
  shared_ptr<duckdb::CSVStateMachine,_true> *local_3c8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_3c0;
  shared_ptr<duckdb::CSVErrorHandler,_true> *local_3b8;
  shared_ptr<duckdb::CSVFileScan,_true> *local_3b0;
  string *local_3a8;
  unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  *local_3a0;
  StringValueResult *local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_390;
  string error_msg;
  bool first_nl;
  undefined7 uStack_367;
  idx_t iStack_360;
  shared_ptr<duckdb::CSVBufferHandle,_true> *local_358;
  shared_ptr<duckdb::CSVBufferManager,_true> *local_350;
  string borked_line;
  string error_message;
  LinesPerBoundary lines_per_batch;
  vector<duckdb::Value,_true> row;
  UnifiedVectorFormat inserted_column_data;
  UnifiedVectorFormat parse_column_data;
  ostringstream error;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198 [45];
  
  local_3b8 = &(this->super_BaseScanner).error_handler;
  local_3b0 = &(this->super_BaseScanner).csv_file_scan;
  local_350 = &(this->super_BaseScanner).buffer_manager;
  local_3c8 = &(this->super_BaseScanner).state_machine;
  local_3d0 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&(this->result).line_positions_per_row;
  local_398 = &this->result;
  local_3a0 = &(this->result).buffer_handles;
  local_3a8 = &(this->result).path;
  local_3c0 = &(this->result).borked_rows._M_h;
  local_358 = &(this->super_BaseScanner).cur_buffer_handle;
  local_3f8 = this;
  local_3d8 = insert_chunk;
  do {
    iVar3 = (*(local_3f8->super_BaseScanner)._vptr_BaseScanner[2])();
    this_02 = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar3));
    DataChunk::Reset(local_3d8);
    pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_3b8);
    CSVErrorHandler::ErrorIfNeeded(pCVar4);
    this_05 = local_3b0;
    if (this_02->count == 0) {
      return;
    }
    local_3d8->count = this_02->count;
    pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(local_3b0);
    local_390 = CSVFileScan::GetNames_abi_cxx11_(pCVar5);
    psVar17 = (string *)0x0;
    while (pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_05), this_01 = local_358,
          psVar17 < (string *)
                    ((long)(pCVar5->super_BaseFileReader).column_ids.column_ids.
                           super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                           .
                           super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pCVar5->super_BaseFileReader).column_ids.column_ids.
                           super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                           .
                           super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      local_3f0 = psVar17;
      pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_05);
      psVar17 = local_3f0;
      if ((pCVar5->projection_ids).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pCVar5->projection_ids).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar5 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_05);
        psVar17 = (string *)
                  (pCVar5->projection_ids).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_3f0].second;
      }
      lVar6 = (long)(this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if ((string *)(lVar6 / 0x68) <= local_3f0) {
        this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10,local_3f0,lVar6 % 0x68);
        ::std::__cxx11::string::string
                  ((string *)&error,"Mismatch between the schema of different files",
                   (allocator *)&row);
        InvalidInputException::InvalidInputException(this_04,(string *)&error);
        __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_3e8 = vector<duckdb::Vector,_true>::get<true>(&this_02->data,(size_type)local_3f0);
      this_03 = vector<duckdb::Vector,_true>::get<true>(&local_3d8->data,(size_type)psVar17);
      local_3e0 = &this_03->type;
      bVar2 = LogicalType::IsJSONType(local_3e0);
      if (bVar2) {
LAB_01aea1fa:
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        error_message._M_string_length = 0;
        error_message.field_2._M_local_buf[0] = '\0';
        line_error = 0;
        pCVar7 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(local_350);
        bVar2 = VectorOperations::TryCast
                          (pCVar7->context,local_3e8,this_03,this_02->count,&error_message,false,
                           true);
        if (!bVar2) {
          UnifiedVectorFormat::UnifiedVectorFormat(&inserted_column_data);
          Vector::ToUnifiedFormat(this_03,this_02->count,&inserted_column_data);
          UnifiedVectorFormat::UnifiedVectorFormat(&parse_column_data);
          Vector::ToUnifiedFormat(local_3e8,this_02->count,&parse_column_data);
          for (; line_error < this_02->count; line_error = line_error + 1) {
            if (inserted_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                validity_mask != (unsigned_long *)0x0) {
              if (((inserted_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                    validity_mask[line_error >> 6] >> (line_error & 0x3f) & 1) == 0) &&
                 ((parse_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                   validity_mask == (unsigned_long *)0x0 ||
                  ((parse_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                    validity_mask[line_error >> 6] & 1L << ((byte)line_error & 0x3f)) != 0))))
              break;
            }
          }
          pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_3c8);
          if ((pCVar8->options->ignore_errors).value == true) {
            row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (uVar18 = 0;
                uVar18 < (ulong)(((long)(this_02->data).
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_02->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x68);
                uVar18 = uVar18 + 1) {
              DataChunk::GetValue((Value *)&error,this_02,uVar18,line_error);
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
              emplace_back<duckdb::Value>
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&row,
                         (Value *)&error);
              Value::~Value((Value *)&error);
            }
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&row);
          }
          pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_3c8);
          bVar2 = CSVReaderOptions::IgnoreErrors(pCVar8->options);
          if (!bVar2) {
            LinesPerBoundary::LinesPerBoundary
                      (&lines_per_batch,
                       (local_3f8->super_BaseScanner).iterator.boundary.boundary_idx,
                       ((local_3f8->super_BaseScanner).lines_read - this_02->count) + line_error);
            first_nl = false;
            pmVar9 = ::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_3d0,&line_error);
            bVar2 = StringValueResult::PrintErrorLine(local_398);
            FullLinePosition::
            ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                      (&borked_line,pmVar9,&first_nl,local_3a0,bVar2);
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
            poVar10 = ::std::operator<<((ostream *)&error,"Could not convert string \"");
            Vector::GetValue((Value *)&row,local_3e8,line_error);
            poVar11 = duckdb::operator<<((ostream *)poVar10,(Value *)&row);
            poVar10 = ::std::operator<<((ostream *)poVar11,"\" to \'");
            LogicalType::ToString_abi_cxx11_(&error_msg,local_3e0);
            poVar10 = ::std::operator<<(poVar10,(string *)&error_msg);
            ::std::operator<<(poVar10,"\'");
            ::std::__cxx11::string::~string((string *)&error_msg);
            Value::~Value((Value *)&row);
            ::std::__cxx11::stringbuf::str();
            FullLinePosition::SanitizeError(&error_msg);
            this_00 = local_3d0;
            pmVar9 = ::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_3d0,&line_error);
            pmVar12 = ::std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](this_00,&line_error);
            bVar2 = LinePosition::operator==(&pmVar9->begin,&pmVar12->end);
            if (bVar2) {
              iVar16 = 0;
            }
            else {
              pmVar9 = ::std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_3d0,&line_error);
              iVar16 = (ulong)first_nl + (pmVar9->begin).buffer_pos +
                       (pmVar9->begin).buffer_idx *
                       (local_3f8->result).super_ScannerResult.result_size;
            }
            pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_3c8);
            pCVar1 = pCVar8->options;
            pCVar13 = (CSVReaderOptions *)
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::get<true>(local_390,(size_type)local_3f0);
            error_info.lines_in_batch = iVar16;
            error_info.boundary_idx = lines_per_batch.lines_in_batch;
            byte_position.index._4_4_ = in_stack_fffffffffffffbec;
            byte_position.index._0_4_ = (uint)local_3e0->id_;
            CSVError::CastError((CSVError *)&row,(CSVError *)pCVar1,pCVar13,&error_msg,local_3f0,
                                (idx_t)&borked_line,(string *)lines_per_batch.boundary_idx,
                                error_info,0xffffffffffffffff,byte_position,(LogicalTypeId)local_3a8
                                ,(string *)CONCAT17(first_nl_1,uStack_408));
            pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_3b8);
            CSVErrorHandler::Error(pCVar4,(CSVError *)&row,false);
            CSVError::~CSVError((CSVError *)&row);
            ::std::__cxx11::string::~string((string *)&error_msg);
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
            ::std::__cxx11::string::~string((string *)&borked_line);
          }
          _error = (pointer)line_error;
          line_error = line_error + 1;
          ::std::__detail::
          _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)local_3c0,(value_type *)&error);
          for (; line_error < this_02->count; line_error = line_error + 1) {
            if (inserted_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                validity_mask != (unsigned_long *)0x0) {
              if (((inserted_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                    validity_mask[line_error >> 6] >> (line_error & 0x3f) & 1) == 0) &&
                 ((parse_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                   validity_mask == (unsigned_long *)0x0 ||
                  ((parse_column_data.validity.super_TemplatedValidityMask<unsigned_long>.
                    validity_mask[line_error >> 6] & 1L << ((byte)line_error & 0x3f)) != 0)))) {
                ::std::__detail::
                _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_3c0,&line_error);
                lines_per_batch.boundary_idx = 0;
                lines_per_batch.lines_in_batch = 0;
                for (uVar18 = 0;
                    uVar18 < (ulong)(((long)(this_02->data).
                                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                            .
                                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this_02->data).
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_start) / 0x68);
                    uVar18 = uVar18 + 1) {
                  DataChunk::GetValue((Value *)&error,this_02,uVar18,line_error);
                  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
                  emplace_back<duckdb::Value>
                            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                             &lines_per_batch,(Value *)&error);
                  Value::~Value((Value *)&error);
                }
                pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_3c8);
                bVar2 = CSVReaderOptions::IgnoreErrors(pCVar8->options);
                if (!bVar2) {
                  LinesPerBoundary::LinesPerBoundary
                            ((LinesPerBoundary *)&first_nl,
                             (local_3f8->super_BaseScanner).iterator.boundary.boundary_idx,
                             ((local_3f8->super_BaseScanner).lines_read - this_02->count) +
                             line_error);
                  first_nl_1 = false;
                  pmVar9 = ::std::__detail::
                           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[](local_3d0,&line_error);
                  bVar2 = StringValueResult::PrintErrorLine(local_398);
                  FullLinePosition::
                  ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                            (&borked_line,pmVar9,&first_nl_1,local_3a0,bVar2);
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
                  poVar10 = ::std::operator<<((ostream *)&error,"Could not convert string \"");
                  Vector::GetValue((Value *)&row,local_3e8,line_error);
                  poVar11 = duckdb::operator<<((ostream *)poVar10,(Value *)&row);
                  poVar10 = ::std::operator<<((ostream *)poVar11,"\" to \'");
                  LogicalTypeIdToString_abi_cxx11_(&error_msg,(duckdb *)(ulong)local_3e0->id_,type);
                  poVar10 = ::std::operator<<(poVar10,(string *)&error_msg);
                  ::std::operator<<(poVar10,"\'");
                  ::std::__cxx11::string::~string((string *)&error_msg);
                  Value::~Value((Value *)&row);
                  ::std::__cxx11::stringbuf::str();
                  FullLinePosition::SanitizeError(&error_msg);
                  pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_3c8);
                  pCVar1 = pCVar8->options;
                  pCVar13 = (CSVReaderOptions *)
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::get<true>(local_390,(size_type)local_3f0);
                  iVar16 = iStack_360;
                  psVar17 = (string *)CONCAT71(uStack_367,first_nl);
                  pmVar9 = ::std::__detail::
                           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[](local_3d0,&line_error);
                  error_info_00.lines_in_batch =
                       (ulong)first_nl_1 + (pmVar9->begin).buffer_pos +
                       (pmVar9->begin).buffer_idx *
                       (local_3f8->result).super_ScannerResult.result_size;
                  error_info_00.boundary_idx = iVar16;
                  byte_position_00.index._4_4_ = in_stack_fffffffffffffbec;
                  byte_position_00.index._0_4_ = (uint)local_3e0->id_;
                  CSVError::CastError((CSVError *)&row,(CSVError *)pCVar1,pCVar13,&error_msg,
                                      local_3f0,(idx_t)&borked_line,psVar17,error_info_00,
                                      0xffffffffffffffff,byte_position_00,(LogicalTypeId)local_3a8,
                                      (string *)CONCAT17(first_nl_1,uStack_408));
                  pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_3b8);
                  CSVErrorHandler::Error(pCVar4,(CSVError *)&row,false);
                  CSVError::~CSVError((CSVError *)&row);
                  ::std::__cxx11::string::~string((string *)&error_msg);
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
                  ::std::__cxx11::string::~string((string *)&borked_line);
                }
                ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                          ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&lines_per_batch
                          );
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&parse_column_data);
          UnifiedVectorFormat::~UnifiedVectorFormat(&inserted_column_data);
        }
        ::std::__cxx11::string::~string((string *)&error_message);
      }
      else {
        LogicalType::LogicalType((LogicalType *)&error,VARCHAR);
        bVar2 = LogicalType::operator==(local_3e0,(LogicalType *)&error);
        if (!bVar2) {
          LogicalType::LogicalType((LogicalType *)&row,VARCHAR);
          bVar2 = LogicalType::operator!=(local_3e0,(LogicalType *)&row);
          if (bVar2) {
            LogicalType::LogicalType((LogicalType *)&inserted_column_data,VARCHAR);
            bVar2 = LogicalType::operator!=(&local_3e8->type,(LogicalType *)&inserted_column_data);
            LogicalType::~LogicalType((LogicalType *)&inserted_column_data);
            LogicalType::~LogicalType((LogicalType *)&row);
            LogicalType::~LogicalType((LogicalType *)&error);
            if (bVar2) goto LAB_01aea318;
          }
          else {
            LogicalType::~LogicalType((LogicalType *)&row);
            LogicalType::~LogicalType((LogicalType *)&error);
          }
          goto LAB_01aea1fa;
        }
        LogicalType::~LogicalType((LogicalType *)&error);
LAB_01aea318:
        Vector::Reinterpret(this_03,local_3e8);
      }
      this_05 = local_3b0;
      psVar17 = (string *)((long)&(local_3f0->_M_dataplus)._M_p + 1);
    }
    if ((local_3f8->result).borked_rows._M_h._M_element_count != 0) {
      SelectionVector::SelectionVector((SelectionVector *)&error,this_02->count);
      iVar16 = 0;
      for (row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start = (pointer)0x0;
          row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start < (pointer)this_02->count;
          row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&((row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start)->type_).physical_type_) {
        iVar14 = ::std::
                 _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(local_3c0,(key_type *)&row);
        if (iVar14.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
          *(int *)(_error + iVar16 * 4) =
               (int)row.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar16 = iVar16 + 1;
        }
      }
      DataChunk::Slice(local_3d8,(SelectionVector *)&error,iVar16);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear(local_3c0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
    }
    if (local_3d8->count != 0) {
      return;
    }
    if ((this_01->internal).super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      return;
    }
    if ((local_3f8->super_BaseScanner).iterator.is_set == true) {
      uVar18 = (local_3f8->super_BaseScanner).iterator.boundary.end_pos;
      pCVar15 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
      if (pCVar15->actual_size < uVar18) goto LAB_01aeaafe;
    }
    else {
LAB_01aeaafe:
      pCVar15 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
      uVar18 = pCVar15->actual_size;
    }
    if (uVar18 <= (local_3f8->super_BaseScanner).iterator.pos.buffer_pos) {
      return;
    }
  } while( true );
}

Assistant:

void StringValueScanner::Flush(DataChunk &insert_chunk) {
	bool continue_processing;
	do {
		continue_processing = false;
		auto &process_result = ParseChunk();
		// First Get Parsed Chunk
		auto &parse_chunk = process_result.ToChunk();
		insert_chunk.Reset();
		// We have to check if we got to error
		error_handler->ErrorIfNeeded();
		if (parse_chunk.size() == 0) {
			return;
		}
		// convert the columns in the parsed chunk to the types of the table
		insert_chunk.SetCardinality(parse_chunk);

		// We keep track of the borked lines, in case we are ignoring errors
		D_ASSERT(csv_file_scan);

		auto &names = csv_file_scan->GetNames();
		// Now Do the cast-aroo
		for (idx_t i = 0; i < csv_file_scan->column_ids.size(); i++) {
			idx_t result_idx = i;
			if (!csv_file_scan->projection_ids.empty()) {
				result_idx = csv_file_scan->projection_ids[i].second;
			}
			if (i >= parse_chunk.ColumnCount()) {
				throw InvalidInputException("Mismatch between the schema of different files");
			}
			auto &parse_vector = parse_chunk.data[i];
			auto &result_vector = insert_chunk.data[result_idx];
			auto &type = result_vector.GetType();
			auto &parse_type = parse_vector.GetType();
			if (!type.IsJSONType() && (type == LogicalType::VARCHAR ||
			                           (type != LogicalType::VARCHAR && parse_type != LogicalType::VARCHAR))) {
				// reinterpret rather than reference
				result_vector.Reinterpret(parse_vector);
			} else {
				string error_message;
				idx_t line_error = 0;
				if (VectorOperations::TryCast(buffer_manager->context, parse_vector, result_vector, parse_chunk.size(),
				                              &error_message, false, true)) {
					continue;
				}
				// An error happened, to propagate it we need to figure out the exact line where the casting failed.
				UnifiedVectorFormat inserted_column_data;
				result_vector.ToUnifiedFormat(parse_chunk.size(), inserted_column_data);
				UnifiedVectorFormat parse_column_data;
				parse_vector.ToUnifiedFormat(parse_chunk.size(), parse_column_data);

				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						break;
					}
				}
				{
					if (state_machine->options.ignore_errors.GetValue()) {
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
					}
					if (!state_machine->options.IgnoreErrors()) {
						LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
						                                 lines_read - parse_chunk.size() + line_error);
						bool first_nl = false;
						auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
						    first_nl, result.buffer_handles, result.PrintErrorLine());
						std::ostringstream error;
						error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
						      << type.ToString() << "\'";
						string error_msg = error.str();
						FullLinePosition::SanitizeError(error_msg);
						idx_t row_byte_pos = 0;
						if (!(result.line_positions_per_row[line_error].begin ==
						      result.line_positions_per_row[line_error].end)) {
							row_byte_pos = result.line_positions_per_row[line_error].begin.GetGlobalPosition(
							    result.result_size, first_nl);
						}
						auto csv_error = CSVError::CastError(
						    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch, row_byte_pos,
						    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
						error_handler->Error(csv_error);
					}
				}
				result.borked_rows.insert(line_error++);
				D_ASSERT(state_machine->options.ignore_errors.GetValue());
				// We are ignoring errors. We must continue but ignoring borked-rows
				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						result.borked_rows.insert(line_error);
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
						if (!state_machine->options.IgnoreErrors()) {
							LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
							                                 lines_read - parse_chunk.size() + line_error);
							bool first_nl = false;
							auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
							    first_nl, result.buffer_handles, result.PrintErrorLine());
							std::ostringstream error;
							// Casting Error Message
							error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
							      << LogicalTypeIdToString(type.id()) << "\'";
							string error_msg = error.str();
							FullLinePosition::SanitizeError(error_msg);
							auto csv_error = CSVError::CastError(
							    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch,
							    result.line_positions_per_row[line_error].begin.GetGlobalPosition(result.result_size,
							                                                                      first_nl),
							    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
							error_handler->Error(csv_error);
						}
					}
				}
			}
		}
		if (!result.borked_rows.empty()) {
			// We must remove the borked lines from our chunk
			SelectionVector successful_rows(parse_chunk.size());
			idx_t sel_idx = 0;
			for (idx_t row_idx = 0; row_idx < parse_chunk.size(); row_idx++) {
				if (result.borked_rows.find(row_idx) == result.borked_rows.end()) {
					successful_rows.set_index(sel_idx++, row_idx);
				}
			}
			// Now we slice the result
			insert_chunk.Slice(successful_rows, sel_idx);
			result.borked_rows.clear();
		}
		if (insert_chunk.size() == 0 && cur_buffer_handle) {
			idx_t to_pos;
			if (iterator.IsBoundarySet()) {
				to_pos = iterator.GetEndPos();
				if (to_pos > cur_buffer_handle->actual_size) {
					to_pos = cur_buffer_handle->actual_size;
				}
			} else {
				to_pos = cur_buffer_handle->actual_size;
			}
			if (iterator.pos.buffer_pos < to_pos) {
				// If a chunk is complete with errors, we might get to this situation where we must proceed with the
				// scanning
				continue_processing = true;
			}
		}
	} while (continue_processing);
}